

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

GLFWglproc glfwGetProcAddress(char *procname)

{
  void *pvVar1;
  undefined8 in_RDI;
  _GLFWwindow *window;
  GLFWglproc local_8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (GLFWglproc)0x0;
  }
  else {
    pvVar1 = _glfwPlatformGetTls((_GLFWtls *)0x2d9de3);
    if (pvVar1 == (void *)0x0) {
      _glfwInputError(0x10002,
                      "Cannot query entry point without a current OpenGL or OpenGL ES context");
      local_8 = (GLFWglproc)0x0;
    }
    else {
      local_8 = (GLFWglproc)(**(code **)((long)pvVar1 + 0x260))(in_RDI);
    }
  }
  return local_8;
}

Assistant:

GLFWAPI GLFWglproc glfwGetProcAddress(const char* procname)
{
    _GLFWwindow* window;
    assert(procname != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    window = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT,
                        "Cannot query entry point without a current OpenGL or OpenGL ES context");
        return NULL;
    }

    return window->context.getProcAddress(procname);
}